

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.h
# Opt level: O3

rgba_vec_t * sfc::to_rgba(rgba_vec_t *__return_storage_ptr__,channel_vec_t *data)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  runtime_error *this;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  allocator_type local_11;
  
  uVar6 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar6 & 3) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,uVar6 >> 2,&local_11);
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(__return_storage_ptr__->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar4 != 0) {
      puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 1;
      uVar6 = 0;
      do {
        iVar3 = (int)uVar6;
        *(uint *)((long)puVar1 + uVar6) =
             CONCAT13(puVar2[iVar3 + 3],
                      CONCAT12(puVar2[iVar3 + 2],
                               CONCAT11(puVar2[iVar3 + 1],puVar2[uVar6 & 0xffffffff])));
        uVar7 = (ulong)uVar5;
        uVar6 = uVar6 + 4;
        uVar5 = uVar5 + 1;
      } while (uVar7 < (ulong)(lVar4 >> 2));
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"RGBA vector size not a multiple of 4");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline rgba_vec_t to_rgba(const channel_vec_t& data) {
  if (data.size() % 4 != 0)
    throw std::runtime_error("RGBA vector size not a multiple of 4");
  rgba_vec_t v(data.size() >> 2);
  for (unsigned i = 0; i < v.size(); ++i) {
    v[i] = (data[i * 4]) + (data[(i * 4) + 1] << 8) + (data[(i * 4) + 2] << 16) + (data[(i * 4) + 3] << 24);
  }
  return v;
}